

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O3

char * varinfo(lua_State *L,TValue *o)

{
  CallInfo *pCVar1;
  lua_CFunction p_Var2;
  StkId pTVar3;
  char *pcVar4;
  char *pcVar5;
  ulong uVar6;
  long lVar7;
  char *local_10;
  
  local_10 = (char *)0x0;
  pCVar1 = L->ci;
  if ((pCVar1->callstatus & 2) != 0) {
    p_Var2 = (pCVar1->func->value_).f;
    if (p_Var2[10] != (_func_int_lua_State_ptr)0x0) {
      lVar7 = 0;
      do {
        if ((TValue *)**(long **)(p_Var2 + lVar7 + 0x20) == o) {
          lVar7 = *(long *)(*(long *)(*(long *)(p_Var2 + 0x18) + 0x58) + lVar7 * 2);
          pcVar5 = "?";
          if (lVar7 != 0) {
            pcVar5 = (char *)(lVar7 + 0x18);
          }
          pcVar4 = "upvalue";
          goto LAB_001126a9;
        }
        lVar7 = lVar7 + 8;
      } while ((ulong)(byte)p_Var2[10] * 8 != lVar7);
    }
    pTVar3 = (pCVar1->u).l.base;
    uVar6 = (long)o - (long)pTVar3;
    if (((-1 < (long)uVar6) && ((long)uVar6 < (long)pCVar1->top - (long)pTVar3)) &&
       (pcVar4 = getobjname(*(Proto **)(p_Var2 + 0x18),
                            (int)((ulong)((long)(pCVar1->u).l.savedpc -
                                         (long)(*(Proto **)(p_Var2 + 0x18))->code) >> 2) + -1,
                            (int)(uVar6 >> 4),&local_10), pcVar5 = local_10, pcVar4 != (char *)0x0))
    {
LAB_001126a9:
      pcVar5 = luaO_pushfstring(L," (%s \'%s\')",pcVar4,pcVar5);
      return pcVar5;
    }
  }
  return "";
}

Assistant:

static const char *varinfo (lua_State *L, const TValue *o) {
  const char *name = NULL;  /* to avoid warnings */
  CallInfo *ci = L->ci;
  const char *kind = NULL;
  if (isLua(ci)) {
    kind = getupvalname(ci, o, &name);  /* check whether 'o' is an upvalue */
    if (!kind && isinstack(ci, o))  /* no? try a register */
      kind = getobjname(ci_func(ci)->p, currentpc(ci),
                        cast_int(o - ci->u.l.base), &name);
  }
  return (kind) ? luaO_pushfstring(L, " (%s '%s')", kind, name) : "";
}